

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

Opnd * __thiscall IR::Opnd::Copy(Opnd *this,Func *func)

{
  bool bVar1;
  IntConstOpnd *pIVar2;
  MemRefOpnd *pMVar3;
  RegBVOpnd *pRVar4;
  LabelOpnd *pLVar5;
  PropertySymOpnd *pPVar6;
  Int64ConstOpnd *pIVar7;
  ArrayRegOpnd *pAVar8;
  FloatConstOpnd *pFVar9;
  IndirOpnd *pIVar10;
  AddrOpnd *pAVar11;
  SymOpnd *pSVar12;
  RegOpnd *pRVar13;
  HelperCallOpnd *pHVar14;
  Opnd *pOVar15;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    pIVar2 = IntConstOpnd::CopyInternal((IntConstOpnd *)this,func);
    return &pIVar2->super_Opnd;
  case OpndKindInt64Const:
    pIVar7 = Int64ConstOpnd::CopyInternal((Int64ConstOpnd *)this,func);
    return &pIVar7->super_Opnd;
  case OpndKindFloatConst:
    pFVar9 = FloatConstOpnd::CopyInternal((FloatConstOpnd *)this,func);
    return &pFVar9->super_Opnd;
  case OpndKindHelperCall:
    bVar1 = HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)this);
    if (bVar1) {
      pOVar15 = (Opnd *)DiagHelperCallOpnd::CopyInternalSub((DiagHelperCallOpnd *)this,func);
      return pOVar15;
    }
    pHVar14 = HelperCallOpnd::CopyInternal((HelperCallOpnd *)this,func);
    return &pHVar14->super_Opnd;
  case OpndKindSym:
    bVar1 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
    if (bVar1) {
      pPVar6 = PropertySymOpnd::CopyInternalSub((PropertySymOpnd *)this,func);
      return (Opnd *)pPVar6;
    }
    pSVar12 = SymOpnd::CopyInternal((SymOpnd *)this,func);
    return &pSVar12->super_Opnd;
  case OpndKindReg:
    bVar1 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar1) {
      pAVar8 = ArrayRegOpnd::CopyInternalSub((ArrayRegOpnd *)this,func);
      return (Opnd *)pAVar8;
    }
    pRVar13 = RegOpnd::CopyInternal((RegOpnd *)this,(StackSym *)this[1]._vptr_Opnd,func);
    return &pRVar13->super_Opnd;
  case OpndKindAddr:
    pAVar11 = AddrOpnd::CopyInternal((AddrOpnd *)this,func);
    return &pAVar11->super_Opnd;
  case OpndKindIndir:
    pIVar10 = IndirOpnd::CopyInternal((IndirOpnd *)this,func);
    return &pIVar10->super_Opnd;
  case OpndKindLabel:
    pLVar5 = LabelOpnd::CopyInternal((LabelOpnd *)this,func);
    return &pLVar5->super_Opnd;
  case OpndKindMemRef:
    pMVar3 = MemRefOpnd::CopyInternal((MemRefOpnd *)this,func);
    return &pMVar3->super_Opnd;
  case OpndKindRegBV:
    pRVar4 = RegBVOpnd::CopyInternal((RegBVOpnd *)this,func);
    return &pRVar4->super_Opnd;
  case OpndKindList:
    pOVar15 = ListOpnd::CopyInternal((ListOpnd *)this,func);
    return pOVar15;
  }
  Copy();
  switch((((PropertySymOpnd *)this)->super_SymOpnd).super_Opnd.m_kind) {
  case OpndKindSym:
    break;
  case OpndKindReg:
    bVar1 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar1) {
      pAVar8 = ArrayRegOpnd::CloneUseInternalSub((ArrayRegOpnd *)this,func);
      return (Opnd *)pAVar8;
    }
    pRVar13 = RegOpnd::CloneUseInternal((RegOpnd *)this,func);
    return &pRVar13->super_Opnd;
  default:
    pOVar15 = Copy(this,func);
    return pOVar15;
  case OpndKindIndir:
    pIVar10 = IndirOpnd::CloneUseInternal((IndirOpnd *)this,func);
    return &pIVar10->super_Opnd;
  case OpndKindList:
    pOVar15 = ListOpnd::CloneUseInternal((ListOpnd *)this,func);
    return pOVar15;
  }
  bVar1 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
  if (bVar1) {
    pPVar6 = PropertySymOpnd::CopyInternalSub((PropertySymOpnd *)this,func);
    return (Opnd *)pPVar6;
  }
  pSVar12 = SymOpnd::CloneUseInternal((SymOpnd *)this,func);
  return &pSVar12->super_Opnd;
}

Assistant:

Opnd * Opnd::Copy(Func *func)
{
    switch (this->m_kind)
    {
    case OpndKindIntConst:
        return static_cast<IntConstOpnd*>(this)->CopyInternal(func);

    case OpndKindInt64Const:
        return static_cast<Int64ConstOpnd*>(this)->CopyInternal(func);

    case OpndKindFloatConst:
        return static_cast<FloatConstOpnd*>(this)->CopyInternal(func);

    case OpndKindHelperCall:
        if ((*static_cast<HelperCallOpnd*>(this)).IsDiagHelperCallOpnd())
        {
            return static_cast<DiagHelperCallOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<HelperCallOpnd*>(this)->CopyInternal(func);

    case OpndKindSym:
        if ((*static_cast<SymOpnd*>(this)).IsPropertySymOpnd())
        {
            return static_cast<PropertySymOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<SymOpnd*>(this)->CopyInternal(func);

    case OpndKindReg:
        if ((*static_cast<RegOpnd*>(this)).IsArrayRegOpnd())
        {
            return static_cast<ArrayRegOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<RegOpnd*>(this)->CopyInternal(func);

    case OpndKindAddr:
        return static_cast<AddrOpnd*>(this)->CopyInternal(func);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->CopyInternal(func);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->CopyInternal(func);

    case OpndKindMemRef:
        return static_cast<MemRefOpnd*>(this)->CopyInternal(func);

    case OpndKindLabel:
        return static_cast<LabelOpnd*>(this)->CopyInternal(func);

    case OpndKindRegBV:
        return static_cast<RegBVOpnd*>(this)->CopyInternal(func);
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);

    };
}